

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_1_3_False(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int i;
  int iVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int k0;
  int iVar23;
  float *pfVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  float *pfVar31;
  int k0_1;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [64];
  undefined1 auVar62 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [64];
  
  auVar42._8_4_ = 0x3effffff;
  auVar42._0_8_ = 0x3effffff3effffff;
  auVar42._12_4_ = 0x3effffff;
  auVar61 = ZEXT1664(auVar42);
  auVar41._8_4_ = 0x80000000;
  auVar41._0_8_ = 0x8000000080000000;
  auVar41._12_4_ = 0x80000000;
  fVar47 = ipoint->scale;
  auVar66 = ZEXT464((uint)fVar47);
  auVar43 = ZEXT416((uint)fVar47);
  auVar34 = vpternlogd_avx512vl(auVar42,auVar43,auVar41,0xf8);
  auVar34 = ZEXT416((uint)(fVar47 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  fVar46 = -0.08 / (fVar47 * fVar47);
  iVar22 = (int)auVar34._0_4_;
  auVar35._0_4_ = (int)auVar34._0_4_;
  auVar35._4_4_ = (int)auVar34._4_4_;
  auVar35._8_4_ = (int)auVar34._8_4_;
  auVar35._12_4_ = (int)auVar34._12_4_;
  auVar34 = vcvtdq2ps_avx(auVar35);
  auVar35 = vpternlogd_avx512vl(auVar42,ZEXT416((uint)ipoint->x),auVar41,0xf8);
  auVar35 = ZEXT416((uint)(ipoint->x + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36._0_8_ = (double)auVar35._0_4_;
  auVar36._8_8_ = auVar35._8_8_;
  auVar40._0_8_ = (double)fVar47;
  auVar40._8_8_ = 0;
  auVar35 = vfmadd231sd_fma(auVar36,auVar40,ZEXT816(0x3fe0000000000000));
  auVar39._0_4_ = (float)auVar35._0_8_;
  auVar39._4_12_ = auVar35._4_12_;
  auVar35 = vpternlogd_avx512vl(auVar42,ZEXT416((uint)ipoint->y),auVar41,0xf8);
  fVar3 = auVar39._0_4_ - auVar34._0_4_;
  auVar35 = ZEXT416((uint)(ipoint->y + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar37._0_8_ = (double)auVar35._0_4_;
  auVar37._8_8_ = auVar35._8_8_;
  auVar35 = vfmadd231sd_fma(auVar37,auVar40,ZEXT816(0x3fe0000000000000));
  auVar38._0_4_ = (float)auVar35._0_8_;
  auVar38._4_12_ = auVar35._4_12_;
  fVar65 = auVar38._0_4_ - auVar34._0_4_;
  auVar36 = ZEXT416((uint)fVar47);
  auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar36,auVar39);
  auVar35 = vpternlogd_avx512vl(auVar42,auVar34,auVar41,0xf8);
  auVar34 = ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  if (iVar22 < (int)auVar34._0_4_) {
    auVar44._8_4_ = 0x3effffff;
    auVar44._0_8_ = 0x3effffff3effffff;
    auVar44._12_4_ = 0x3effffff;
    auVar45._8_4_ = 0x80000000;
    auVar45._0_8_ = 0x8000000080000000;
    auVar45._12_4_ = 0x80000000;
    auVar34 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar36,auVar38);
    auVar35 = vpternlogd_avx512vl(auVar45,auVar34,auVar44,0xea);
    auVar34 = ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_));
    auVar34 = vroundss_avx(auVar34,auVar34,0xb);
    if (iVar22 < (int)auVar34._0_4_) {
      auVar34 = vfmadd231ss_fma(auVar39,auVar36,ZEXT416(0x41300000));
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar35 = vpternlogd_avx512vl(auVar58,auVar34,auVar44,0xea);
      auVar34 = ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_));
      auVar34 = vroundss_avx(auVar34,auVar34,0xb);
      if ((int)auVar34._0_4_ + iVar22 <= iimage->width) {
        auVar34 = vfmadd231ss_fma(auVar38,auVar36,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar35 = vpternlogd_avx512vl(auVar44,auVar34,auVar13,0xf8);
        auVar34 = ZEXT416((uint)(auVar34._0_4_ + auVar35._0_4_));
        auVar34 = vroundss_avx(auVar34,auVar34,0xb);
        if ((int)auVar34._0_4_ + iVar22 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          iVar16 = -0xc;
          lVar26 = 8;
          for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 1) {
            auVar34._0_4_ = (float)iVar16;
            auVar34._4_12_ = in_ZMM8._4_12_;
            auVar34 = vfmadd213ss_fma(auVar34,auVar66._0_16_,ZEXT416((uint)(fVar65 + 0.5)));
            iVar15 = (int)auVar34._0_4_;
            lVar25 = lVar26;
            for (iVar23 = -0xc; iVar23 < 0xc; iVar23 = iVar23 + 3) {
              auVar50._0_4_ = (float)iVar23;
              auVar50._4_12_ = in_ZMM8._4_12_;
              auVar34 = vfmadd213ss_fma(auVar50,auVar43,ZEXT416((uint)fVar3));
              auVar51._0_4_ = (float)(iVar23 + 1);
              auVar51._4_12_ = in_ZMM8._4_12_;
              auVar35 = vfmadd213ss_fma(auVar51,auVar43,ZEXT416((uint)fVar3));
              auVar52._0_4_ = (float)(iVar23 + 2);
              auVar52._4_12_ = auVar61._4_12_;
              auVar36 = vfmadd213ss_fma(auVar52,auVar43,ZEXT416((uint)fVar3));
              haarXY_unconditional
                        (iimage,iVar15,(int)auVar34._0_4_,iVar22,
                         (float *)((long)haarResponseX + lVar25 + -8),
                         (float *)((long)haarResponseY + lVar25 + -8));
              haarXY_unconditional
                        (iimage,iVar15,(int)auVar35._0_4_,iVar22,
                         (float *)((long)haarResponseX + lVar25 + -4),
                         (float *)((long)haarResponseY + lVar25 + -4));
              haarXY_unconditional
                        (iimage,iVar15,(int)auVar36._0_4_,iVar22,
                         (float *)((long)haarResponseX + lVar25),
                         (float *)((long)haarResponseY + lVar25));
              lVar25 = lVar25 + 0xc;
            }
            auVar66 = ZEXT1664(auVar43);
            iVar16 = iVar16 + 1;
            lVar26 = lVar26 + 0x60;
          }
          goto LAB_0015d1c6;
        }
      }
    }
  }
  iVar16 = -0xc;
  lVar26 = 8;
  for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 1) {
    auVar48._0_4_ = (float)iVar16;
    auVar48._4_12_ = in_ZMM8._4_12_;
    auVar34 = vfmadd213ss_fma(auVar48,auVar66._0_16_,ZEXT416((uint)fVar65));
    fVar47 = auVar34._0_4_;
    iVar15 = (int)((double)((ulong)(0.0 <= fVar47) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar47) * -0x4020000000000000) + (double)fVar47);
    lVar25 = lVar26;
    for (iVar23 = -0xc; iVar23 < 0xc; iVar23 = iVar23 + 3) {
      auVar49._0_4_ = (float)iVar23;
      auVar62 = in_ZMM8._4_12_;
      auVar49._4_12_ = auVar62;
      auVar34 = vfmadd213ss_fma(auVar49,auVar43,ZEXT416((uint)fVar3));
      auVar54._0_4_ = (float)(iVar23 + 1);
      auVar54._4_12_ = auVar62;
      auVar57._0_4_ = (float)(iVar23 + 2);
      auVar57._4_12_ = auVar62;
      auVar35 = vfmadd213ss_fma(auVar54,auVar43,ZEXT416((uint)fVar3));
      auVar36 = vfmadd213ss_fma(auVar57,auVar43,ZEXT416((uint)fVar3));
      fVar47 = auVar34._0_4_;
      fVar53 = auVar35._0_4_;
      fVar55 = auVar36._0_4_;
      haarXY_precheck_boundaries
                (iimage,iVar15,
                 (int)((double)((ulong)(0.0 <= fVar47) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar47) * -0x4020000000000000) + (double)fVar47),iVar22
                 ,(float *)((long)haarResponseX + lVar25 + -8),
                 (float *)((long)haarResponseY + lVar25 + -8));
      haarXY_precheck_boundaries
                (iimage,iVar15,
                 (int)((double)((ulong)(0.0 <= fVar53) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar53) * -0x4020000000000000) + (double)fVar53),iVar22
                 ,(float *)((long)haarResponseX + lVar25 + -4),
                 (float *)((long)haarResponseY + lVar25 + -4));
      haarXY_precheck_boundaries
                (iimage,iVar15,
                 (int)((double)((ulong)(0.0 <= fVar55) * 0x3fe0000000000000 +
                               (ulong)(0.0 > fVar55) * -0x4020000000000000) + (double)fVar55),iVar22
                 ,(float *)((long)haarResponseX + lVar25),(float *)((long)haarResponseY + lVar25));
      lVar25 = lVar25 + 0xc;
    }
    auVar66 = ZEXT1664(auVar43);
    iVar16 = iVar16 + 1;
    lVar26 = lVar26 + 0x60;
  }
LAB_0015d1c6:
  fVar65 = auVar66._0_4_;
  auVar64._8_4_ = 0x3effffff;
  auVar64._0_8_ = 0x3effffff3effffff;
  auVar64._12_4_ = 0x3effffff;
  auVar63._8_4_ = 0x80000000;
  auVar63._0_8_ = 0x8000000080000000;
  auVar63._12_4_ = 0x80000000;
  auVar34 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 0.5)),auVar63,0xf8);
  auVar34 = ZEXT416((uint)(fVar65 * 0.5 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 1.5)),auVar63,0xf8);
  auVar35 = ZEXT416((uint)(fVar65 * 1.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 2.5)),auVar63,0xf8);
  auVar36 = ZEXT416((uint)(fVar65 * 2.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 3.5)),auVar63,0xf8);
  auVar37 = ZEXT416((uint)(fVar65 * 3.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 4.5)),auVar63,0xf8);
  auVar38 = ZEXT416((uint)(fVar65 * 4.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 5.5)),auVar63,0xf8);
  auVar39 = ZEXT416((uint)(fVar65 * 5.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 6.5)),auVar63,0xf8);
  auVar40 = ZEXT416((uint)(fVar65 * 6.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 7.5)),auVar63,0xf8);
  auVar41 = ZEXT416((uint)(auVar41._0_4_ + fVar65 * 7.5));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 8.5)),auVar63,0xf8);
  auVar42 = ZEXT416((uint)(fVar65 * 8.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 9.5)),auVar63,0xf8);
  auVar43 = ZEXT416((uint)(fVar65 * 9.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 10.5)),auVar63,0xf8);
  auVar44 = ZEXT416((uint)(fVar65 * 10.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 11.5)),auVar63,0xf8);
  fVar56 = auVar36._0_4_;
  fVar47 = fVar56 + auVar35._0_4_;
  fVar3 = fVar56 + auVar34._0_4_;
  auVar36 = ZEXT416((uint)(fVar65 * 11.5 + auVar45._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  fVar65 = fVar56 - auVar34._0_4_;
  fVar53 = fVar56 - auVar35._0_4_;
  fVar55 = fVar56 - auVar37._0_4_;
  fVar4 = fVar56 - auVar38._0_4_;
  fVar5 = fVar56 - auVar39._0_4_;
  fVar56 = fVar56 - auVar40._0_4_;
  fVar60 = auVar41._0_4_;
  fVar6 = fVar60 - auVar37._0_4_;
  fVar7 = fVar60 - auVar38._0_4_;
  fVar8 = fVar60 - auVar39._0_4_;
  fVar9 = fVar60 - auVar40._0_4_;
  fVar10 = fVar60 - auVar42._0_4_;
  fVar11 = fVar60 - auVar43._0_4_;
  fVar12 = fVar60 - auVar44._0_4_;
  fVar60 = fVar60 - auVar36._0_4_;
  gauss_s1_c0[0] = expf(fVar47 * fVar47 * fVar46);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar46);
  gauss_s1_c0[2] = expf(fVar65 * fVar65 * fVar46);
  gauss_s1_c0[3] = expf(fVar53 * fVar53 * fVar46);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar55 * fVar55 * fVar46);
  gauss_s1_c0[6] = expf(fVar4 * fVar4 * fVar46);
  gauss_s1_c0[7] = expf(fVar5 * fVar5 * fVar46);
  gauss_s1_c0[8] = expf(fVar56 * fVar56 * fVar46);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar46);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar46);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar46);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar46);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar46);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar46);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar46);
  gauss_s1_c1[8] = expf(fVar60 * fVar60 * fVar46);
  auVar61 = ZEXT1264(ZEXT812(0));
  lVar26 = 0;
  auVar43._8_4_ = 0x7fffffff;
  auVar43._0_8_ = 0x7fffffff7fffffff;
  auVar43._12_4_ = 0x7fffffff;
  iVar22 = 0;
  lVar19 = 0;
  uVar21 = 0xfffffffffffffff8;
  while (uVar18 = (uint)uVar21, (int)uVar18 < 8) {
    pfVar27 = gauss_s1_c1;
    if (uVar18 != 7) {
      pfVar27 = gauss_s1_c0;
    }
    lVar25 = (long)iVar22;
    lVar19 = (long)(int)lVar19;
    iVar22 = iVar22 + 4;
    if (uVar18 == 0xfffffff8) {
      pfVar27 = gauss_s1_c1;
    }
    uVar33 = 0;
    uVar32 = 0xfffffffffffffff8;
    lVar17 = lVar26;
    while (lVar25 != iVar22) {
      pfVar24 = gauss_s1_c1;
      iVar16 = (int)uVar32;
      if (iVar16 != 7) {
        pfVar24 = gauss_s1_c0;
      }
      auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar32 = (ulong)((uint)(uVar32 >> 0x1c) & 8);
      if (iVar16 == -8) {
        pfVar24 = gauss_s1_c1;
      }
      lVar28 = (long)haarResponseX + lVar17;
      lVar29 = (long)haarResponseY + lVar17;
      for (uVar20 = uVar33; uVar20 < iVar16 * 0x18 + 0x198; uVar20 = uVar20 + 0x18) {
        lVar30 = 0;
        pfVar31 = (float *)((long)pfVar27 + (ulong)(((uint)(uVar21 >> 0x1f) & 1) << 5));
        while (lVar30 != 9) {
          fVar47 = *pfVar31;
          pfVar31 = pfVar31 + (ulong)(~uVar18 >> 0x1f) * 2 + -1;
          lVar1 = lVar30 * 4;
          lVar2 = lVar30 * 4;
          lVar30 = lVar30 + 1;
          auVar36 = ZEXT416((uint)(pfVar24[uVar32] * fVar47 * *(float *)(lVar28 + lVar2)));
          auVar34 = vandps_avx(auVar36,auVar43);
          auVar37 = ZEXT416((uint)(pfVar24[uVar32] * fVar47 * *(float *)(lVar29 + lVar1)));
          auVar35 = vandps_avx(auVar37,auVar43);
          auVar36 = vinsertps_avx(auVar37,auVar36,0x10);
          auVar35 = vmovlhps_avx(auVar36,auVar35);
          auVar34 = vinsertps_avx(auVar35,auVar34,0x30);
          auVar66 = ZEXT1664(CONCAT412(auVar66._12_4_ + auVar34._12_4_,
                                       CONCAT48(auVar66._8_4_ + auVar34._8_4_,
                                                CONCAT44(auVar66._4_4_ + auVar34._4_4_,
                                                         auVar66._0_4_ + auVar34._0_4_))));
        }
        uVar32 = uVar32 + (ulong)(-1 < iVar16) * 2 + -1;
        lVar28 = lVar28 + 0x60;
        lVar29 = lVar29 + 0x60;
      }
      uVar32 = (ulong)(iVar16 + 5);
      uVar33 = uVar33 + 0x78;
      lVar17 = lVar17 + 0x1e0;
      fVar47 = gauss_s2_arr[lVar25];
      auVar14._4_4_ = fVar47;
      auVar14._0_4_ = fVar47;
      auVar14._8_4_ = fVar47;
      auVar14._12_4_ = fVar47;
      auVar37 = vmulps_avx512vl(auVar66._0_16_,auVar14);
      lVar25 = lVar25 + 1;
      auVar59._0_4_ = auVar37._0_4_ * auVar37._0_4_;
      auVar59._4_4_ = auVar37._4_4_ * auVar37._4_4_;
      auVar59._8_4_ = auVar37._8_4_ * auVar37._8_4_;
      auVar59._12_4_ = auVar37._12_4_ * auVar37._12_4_;
      auVar35 = vshufpd_avx(auVar37,auVar37,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar19) = auVar37;
      lVar19 = lVar19 + 4;
      auVar34 = vmovshdup_avx(auVar59);
      auVar36 = vfmadd231ss_fma(auVar34,auVar37,auVar37);
      auVar34 = vshufps_avx(auVar37,auVar37,0xff);
      auVar35 = vfmadd213ss_fma(auVar35,auVar35,auVar36);
      auVar34 = vfmadd213ss_fma(auVar34,auVar34,auVar35);
      auVar61 = ZEXT464((uint)(auVar61._0_4_ + auVar34._0_4_));
    }
    lVar26 = lVar26 + 0x14;
    uVar21 = (ulong)(uVar18 + 5);
  }
  if (auVar61._0_4_ < 0.0) {
    fVar47 = sqrtf(auVar61._0_4_);
  }
  else {
    auVar34 = vsqrtss_avx(auVar61._0_16_,auVar61._0_16_);
    fVar47 = auVar34._0_4_;
  }
  for (lVar26 = 0; lVar26 != 0x40; lVar26 = lVar26 + 1) {
    ipoint->descriptor[lVar26] = (1.0 / fVar47) * ipoint->descriptor[lVar26];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_3_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}